

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_reader.cc
# Opt level: O0

bool __thiscall NanomsgReader::nextPacket(NanomsgReader *this,array<unsigned_char,_892UL> *out)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  runtime_error *this_00;
  size_type sVar4;
  pointer __dest;
  array<unsigned_char,_892UL> *in_RSI;
  undefined8 in_RDI;
  stringstream ss;
  int nbytes;
  void *buf;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  void *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  stringstream local_1a8 [16];
  ostream local_198 [380];
  int local_1c;
  void *local_18;
  array<unsigned_char,_892UL> *local_10;
  
  local_18 = (void *)0x0;
  local_10 = in_RSI;
  do {
    iVar1 = nn_recv(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                    CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                    (int)((ulong)in_RDI >> 0x20));
    local_1c = iVar1;
    if (iVar1 < 0) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar2 = std::operator<<(local_198,"nn_recv: ");
      nn_errno();
      pcVar3 = nn_strerror(0);
      std::operator<<(poVar2,pcVar3);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(this_00,(string *)&stack0xfffffffffffffe28);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar4 = std::array<unsigned_char,_892UL>::size(local_10);
  } while (iVar1 != (int)sVar4);
  __dest = std::array<unsigned_char,_892UL>::data((array<unsigned_char,_892UL> *)0x14099a);
  memcpy(__dest,local_18,(long)local_1c);
  nn_freemsg((void *)0x1409bf);
  return true;
}

Assistant:

bool NanomsgReader::nextPacket(std::array<uint8_t, 892>& out) {
  void* buf = nullptr;
  int nbytes;
  for (;;) {
    nbytes = nn_recv(fd_, &buf, NN_MSG, 0);
    if (nbytes < 0) {
      std::stringstream ss;
      ss << "nn_recv: " << nn_strerror(nn_errno());
      throw std::runtime_error(ss.str());
    }
    if (nbytes != (int) out.size()) {
      continue;
    }

    memcpy(out.data(), buf, nbytes);
    nn_freemsg(buf);
    return true;
  }
}